

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

int32_t uprv_compareInvEbcdic_63
                  (UDataSwapper *ds,char *outString,int32_t outLength,UChar *localString,
                  int32_t localLength)

{
  byte bVar1;
  UChar UVar2;
  uint uVar3;
  size_t sVar4;
  int32_t iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  iVar5 = 0;
  if ((-2 < localLength && -2 < outLength) &&
      (localString != (UChar *)0x0 && outString != (char *)0x0)) {
    if (outLength < 0) {
      sVar4 = strlen(outString);
      outLength = (int32_t)sVar4;
    }
    if (localLength < 0) {
      localLength = u_strlen_63(localString);
    }
    iVar5 = outLength - localLength;
    if (outLength < localLength) {
      localLength = outLength;
    }
    if (0 < localLength) {
      iVar7 = localLength + 1;
      lVar6 = 0;
      do {
        uVar3 = 0;
        if ((ulong)(byte)outString[lVar6] != 0) {
          bVar1 = ""[(byte)outString[lVar6]];
          uVar3 = (uint)bVar1;
          if ((bVar1 == 0) || ((invariantChars[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0)) {
            uVar3 = 0xffffffff;
          }
        }
        UVar2 = localString[lVar6];
        uVar8 = (uint)(ushort)UVar2;
        if ((0x7f < (ushort)UVar2) ||
           ((invariantChars[(ushort)UVar2 >> 5] >> ((ushort)UVar2 & 0x1f) & 1) == 0)) {
          uVar8 = 0xfffffffe;
        }
        if (uVar3 - uVar8 != 0) {
          return uVar3 - uVar8;
        }
        iVar7 = iVar7 + -1;
        lVar6 = lVar6 + 1;
      } while (1 < iVar7);
    }
  }
  return iVar5;
}

Assistant:

U_CFUNC int32_t
uprv_compareInvEbcdic(const UDataSwapper *ds,
                      const char *outString, int32_t outLength,
                      const UChar *localString, int32_t localLength) {
    (void)ds;
    int32_t minLength;
    UChar32 c1, c2;
    uint8_t c;

    if(outString==NULL || outLength<-1 || localString==NULL || localLength<-1) {
        return 0;
    }

    if(outLength<0) {
        outLength=(int32_t)uprv_strlen(outString);
    }
    if(localLength<0) {
        localLength=u_strlen(localString);
    }

    minLength= outLength<localLength ? outLength : localLength;

    while(minLength>0) {
        c=(uint8_t)*outString++;
        if(c==0) {
            c1=0;
        } else if((c1=asciiFromEbcdic[c])!=0 && UCHAR_IS_INVARIANT(c1)) {
            /* c1 is set */
        } else {
            c1=-1;
        }

        c2=*localString++;
        if(!UCHAR_IS_INVARIANT(c2)) {
            c2=-2;
        }

        if((c1-=c2)!=0) {
            return c1;
        }

        --minLength;
    }

    /* strings start with same prefix, compare lengths */
    return outLength-localLength;
}